

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O3

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::remove
          (SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,char *__filename)

{
  Node ****ppppNVar1;
  uint uVar2;
  undefined4 uVar3;
  IntermediateNode *pIVar4;
  uint64_t uVar5;
  TermList *pTVar6;
  TermList *pTVar7;
  undefined8 uVar8;
  Node *pNVar9;
  Self SVar10;
  int iVar11;
  int extraout_EAX;
  Node ***pppNVar12;
  Entry *pEVar13;
  Node **inode;
  TermList **ppTVar14;
  ulong uVar15;
  byte *in_RDX;
  TermList TVar16;
  ulong uVar17;
  Node *node;
  Top TVar18;
  Stack<Kernel::TermList_*> subterms;
  TermList t;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  history;
  Stack<Kernel::TermList_*> local_a8;
  TermList local_88;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_80;
  byte local_6c;
  undefined8 local_6b;
  undefined4 local_63;
  uint uStack_5f;
  byte bStack_5b;
  undefined2 uStack_5a;
  undefined2 uStack_58;
  undefined4 uStack_56;
  undefined2 uStack_52;
  undefined1 uStack_50;
  undefined4 uStack_4f;
  undefined1 uStack_4b;
  undefined2 uStack_4a;
  undefined1 uStack_48;
  undefined1 uStack_47;
  undefined6 uStack_46;
  undefined1 local_40;
  undefined4 uStack_3f;
  undefined3 uStack_3b;
  byte *local_38;
  undefined4 extraout_var;
  
  inode = &this->_root;
  local_38 = in_RDX;
  Lib::
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_80);
  while (iVar11 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[2])(),
        SVar10._M_t.
        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>,_true,_true>
                )local_80._self, (char)iVar11 == '\0') {
    pppNVar12 = *(Node ****)
                 ((long)local_80._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                        ._M_head_impl + 0x10);
    if (pppNVar12 ==
        *(Node ****)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                ._M_head_impl + 0x18)) {
      Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>::expand
                ((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>
                  *)local_80._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                    ._M_head_impl);
      pppNVar12 = *(Node ****)
                   ((long)SVar10._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                          ._M_head_impl + 0x10);
    }
    *pppNVar12 = inode;
    ppppNVar1 = (Node ****)
                ((long)SVar10._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10);
    *ppppNVar1 = *ppppNVar1 + 1;
    pIVar4 = (IntermediateNode *)*inode;
    local_a8._capacity = CONCAT44(local_a8._capacity._4_4_,pIVar4->childVar);
    pEVar13 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
              findEntry((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                         *)__filename,(uint *)&local_a8);
    local_88._content = (pEVar13->_val)._content;
    TVar18 = Kernel::TermList::top(&local_88);
    iVar11 = (*(pIVar4->super_Node)._vptr_Node[10])
                       (pIVar4,TVar18._inner._inner._0_8_,(ulong)(TVar18._inner._inner._8_4_ & 0xff)
                        ,0);
    inode = (Node **)CONCAT44(extraout_var,iVar11);
    uVar5 = (((IntermediateNode *)*inode)->super_Node)._term._content;
    if (uVar5 != local_88._content) {
      uVar2 = *(uint *)(uVar5 + 0xc);
      local_a8._capacity = 0x78;
      local_a8._stack = (TermList **)::operator_new(0x3c0,0x10);
      local_a8._end = local_a8._stack + local_a8._capacity;
      local_a8._cursor = local_a8._stack;
      if (local_a8._capacity == 0) {
        Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
      }
      TVar16._content = local_88._content;
      *local_a8._cursor = (TermList *)(uVar5 + (ulong)(uVar2 & 0xfffffff) * 8 + 0x28);
      local_a8._cursor = local_a8._cursor + 1;
      uVar2 = *(uint *)(local_88._content + 0xc);
      if (local_a8._cursor == local_a8._end) {
        Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
      }
      *local_a8._cursor = (TermList *)(TVar16._content + (ulong)(uVar2 & 0xfffffff) * 8 + 0x28);
      local_a8._cursor = local_a8._cursor + 1;
      while (local_a8._cursor != local_a8._stack) {
        pTVar6 = local_a8._cursor[-1];
        ppTVar14 = local_a8._cursor + -2;
        pTVar7 = local_a8._cursor[-2];
        if ((pTVar6[-1]._content & 3) != 2) {
          local_a8._cursor = ppTVar14;
          if (ppTVar14 == local_a8._end) {
            Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
          }
          *local_a8._cursor = pTVar7 + -1;
          local_a8._cursor = local_a8._cursor + 1;
          if (local_a8._cursor == local_a8._end) {
            Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
          }
          *local_a8._cursor = pTVar6 + -1;
          ppTVar14 = local_a8._cursor + 1;
        }
        uVar15 = pTVar7->_content;
        TVar16._content = pTVar6->_content;
        local_a8._cursor = ppTVar14;
        if (uVar15 != TVar16._content) {
          if ((uVar15 & 1) == 0) {
            uVar17 = (ulong)(*(uint *)(uVar15 + 0xc) & 0xfffffff);
            if ((*(uint *)(uVar15 + 0x28 + uVar17 * 8) & 3) != 2) {
              if (ppTVar14 == local_a8._end) {
                Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
                TVar16._content = pTVar6->_content;
              }
              *local_a8._cursor = (TermList *)(uVar15 + uVar17 * 8 + 0x28);
              local_a8._cursor = local_a8._cursor + 1;
              uVar2 = *(uint *)(TVar16._content + 0xc);
              if (local_a8._cursor == local_a8._end) {
                Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
              }
              *local_a8._cursor =
                   (TermList *)((ulong)(uVar2 & 0xfffffff) * 8 + 0x28 + TVar16._content);
              local_a8._cursor = local_a8._cursor + 1;
            }
          }
          else {
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *
                       )__filename,(uint)(uVar15 >> 2),TVar16);
          }
        }
      }
      if (local_a8._stack != (TermList **)0x0) {
        uVar15 = local_a8._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar15 == 0) {
          *local_a8._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a8._stack;
        }
        else if (uVar15 < 0x11) {
          *local_a8._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a8._stack;
        }
        else if (uVar15 < 0x19) {
          *local_a8._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a8._stack;
        }
        else if (uVar15 < 0x21) {
          *local_a8._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a8._stack;
        }
        else if (uVar15 < 0x31) {
          *local_a8._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a8._stack;
        }
        else if (uVar15 < 0x41) {
          *local_a8._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a8._stack;
        }
        else {
          operator_delete(local_a8._stack,0x10);
        }
      }
    }
  }
  uStack_50 = 0;
  uStack_4f = 0;
  uStack_4b = 0;
  uStack_4a = 0;
  uStack_48 = 0;
  uStack_47 = 0;
  bStack_5b = 0;
  uStack_5a = 0;
  uStack_58 = 0;
  uStack_52 = 0;
  uStack_3b = 0;
  local_6c = *local_38 & 3;
  local_6b = *(undefined8 *)(local_38 + 1);
  local_63 = *(undefined4 *)(local_38 + 9);
  uStack_5f = (uint)local_38[0xd];
  if (local_38[0xd] == 1) {
    bStack_5b = local_38[0x11] & 3;
    uVar3 = *(undefined4 *)(local_38 + 0x22);
    uVar8 = *(undefined8 *)(local_38 + 0x1a);
    uStack_5a = (undefined2)*(undefined4 *)(local_38 + 0x12);
    uStack_58 = (undefined2)((uint)*(undefined4 *)(local_38 + 0x12) >> 0x10);
    uStack_52 = (undefined2)uVar8;
    uStack_50 = (undefined1)((ulong)uVar8 >> 0x10);
    uStack_4f = (undefined4)((ulong)uVar8 >> 0x18);
    uStack_4b = (undefined1)((ulong)uVar8 >> 0x38);
    uStack_4a = (undefined2)uVar3;
    uStack_48 = (undefined1)((uint)uVar3 >> 0x10);
    uStack_47 = (undefined1)((uint)uVar3 >> 0x18);
  }
  uStack_56 = 0;
  local_40 = 0;
  uStack_46 = 0;
  uStack_3f = *(undefined4 *)(local_38 + 0x2d);
  (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[10])();
  ensureLeafEfficiency((Leaf **)inode);
  do {
    iVar11 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[3])();
    if ((char)iVar11 == '\0') {
LAB_002ea4ac:
      Lib::
      Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_80);
      return extraout_EAX;
    }
    pIVar4 = (IntermediateNode *)*inode;
    local_a8._capacity = (pIVar4->super_Node)._term._content;
    if (*(Node ****)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                ._M_head_impl + 0x10) ==
        *(Node ****)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                ._M_head_impl + 8)) {
      (*(pIVar4->super_Node)._vptr_Node[1])(pIVar4);
      *inode = (Node *)0x0;
      goto LAB_002ea4ac;
    }
    pNVar9 = *(*(Node ****)
                ((long)local_80._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10))[-1];
    TVar18 = Kernel::TermList::top((TermList *)&local_a8);
    (*pNVar9->_vptr_Node[0xb])
              (pNVar9,TVar18._inner._inner._0_8_,(ulong)(TVar18._inner._inner._8_4_ & 0xff));
    (*(pIVar4->super_Node)._vptr_Node[1])(pIVar4);
    pppNVar12 = *(Node ****)
                 ((long)local_80._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                        ._M_head_impl + 0x10);
    *(Node ****)
     ((long)local_80._self._M_t.
            super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
            .
            super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
            ._M_head_impl + 0x10) = pppNVar12 + -1;
    inode = pppNVar12[-1];
    ensureIntermediateNodeEfficiency((IntermediateNode **)inode);
  } while( true );
}

Assistant:

void SubstitutionTree<LeafData_>::remove(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_REMOVE(0, "remove: ", svBindings, " from ", *this)

  ASS(*pnode);

  Recycled<Stack<Node**>> history;

  while (! (*pnode)->isLeaf()) {
    history->push(pnode);

    IntermediateNode* inode=static_cast<IntermediateNode*>(*pnode);

    unsigned boundVar=inode->childVar;
    TermList t = svBindings.get(boundVar);

    pnode=inode->childByTop(t.top(),false);
    ASS(pnode);


    TermList* s = &(*pnode)->term();
    ASS(TermList::sameTop(*s,t));

    if(*s==t) {
      continue;
    }

    ASS(! s->isVar());
    TermList* ss = s->term()->args();
    ASS(!ss->isEmpty());

    // computing the disagreement set of the two terms
    Stack<TermList*> subterms(120);

    subterms.push(ss);
    subterms.push(t.term()->args());
    while (! subterms.isEmpty()) {
      TermList* tt = subterms.pop();
      ss = subterms.pop();
      if (tt->next()->isEmpty()) {
	ASS(ss->next()->isEmpty());
      }
      else {
	subterms.push(ss->next());
	subterms.push(tt->next());
      }
      if (*ss==*tt) {
	continue;
      }
      if (ss->isVar()) {
	ASS(ss->isSpecialVar());
	svBindings.set(ss->var(),*tt);
	continue;
      }
      ASS(! tt->isVar());
      ASS(ss->term()->functor() == tt->term()->functor());
      ss = ss->term()->args();
      if (! ss->isEmpty()) {
	ASS(! tt->term()->args()->isEmpty());
	subterms.push(ss);
	subterms.push(tt->term()->args());
      }
    }
  }

  ASS ((*pnode)->isLeaf());


  Leaf* lnode = static_cast<Leaf*>(*pnode);
  lnode->remove(ld);
  ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));

  while( (*pnode)->isEmpty() ) {
    TermList term=(*pnode)->term();
    if(history->isEmpty()) {
      delete *pnode;
      *pnode=0;
      DEBUG_REMOVE(0, "out: ", *this);
      return;
    } else {
      Node* node=*pnode;
      IntermediateNode* parent=static_cast<IntermediateNode*>(*history->top());
      parent->remove(term.top());
      delete node;
      pnode = history->pop();
      ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pnode));
    }
  }
  DEBUG_REMOVE(0, "out: ", *this);
}